

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

void __thiscall PSBTInput::Merge(PSBTInput *this,PSBTInput *input)

{
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  uint uVar1;
  long lVar2;
  element_type *peVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uchar *puVar8;
  uint uVar9;
  uint256 *puVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0) &&
     (peVar3 = (input->non_witness_utxo).
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar3 != (element_type *)0x0)) {
    (this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->non_witness_utxo).
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(input->non_witness_utxo).
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  if (((this->witness_utxo).nValue == -1) && (lVar4 = (input->witness_utxo).nValue, lVar4 != -1)) {
    (this->witness_utxo).nValue = lVar4;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(this->witness_utxo).scriptPubKey.super_CScriptBase,
               &(input->witness_utxo).scriptPubKey.super_CScriptBase);
  }
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              *)&this->partial_sigs,
             (input->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )&(input->partial_sigs)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->ripemd160_preimages,
             (input->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->sha256_preimages,
             (input->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->sha256_preimages)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<uint160,std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint160>,std::allocator<std::pair<uint160_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->hash160_preimages,
             (input->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->hash160_preimages)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->hash256_preimages,
             (input->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->hash256_preimages)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<CPubKey_const,KeyOriginInfo>>>
            ((_Rb_tree<CPubKey,std::pair<CPubKey_const,KeyOriginInfo>,std::_Select1st<std::pair<CPubKey_const,KeyOriginInfo>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
              *)&this->hd_keypaths,
             (input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_CPubKey,_KeyOriginInfo>_>)
             &(input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header);
  this_00 = &this->unknown;
  std::
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)this_00,(input->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->unknown)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->m_tap_script_sigs,
             (input->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )&(input->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
            ((_Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
              *)&this->m_tap_scripts,
             (input->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              )&(input->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
            ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
              *)&this->m_tap_bip32_paths,
             (input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
              )&(input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar9 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar9 = uVar1;
  }
  if (uVar9 == 0) {
    uVar1 = (input->redeem_script).super_CScriptBase._size;
    uVar9 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar9 = uVar1;
    }
    if (uVar9 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->redeem_script).super_CScriptBase,&(input->redeem_script).super_CScriptBase)
      ;
    }
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar9 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar9 = uVar1;
  }
  if (uVar9 == 0) {
    uVar1 = (input->witness_script).super_CScriptBase._size;
    uVar9 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar9 = uVar1;
    }
    if (uVar9 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->witness_script).super_CScriptBase,
                 &(input->witness_script).super_CScriptBase);
    }
  }
  uVar1 = (this->final_script_sig).super_CScriptBase._size;
  uVar9 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar9 = uVar1;
  }
  if (uVar9 == 0) {
    uVar1 = (input->final_script_sig).super_CScriptBase._size;
    uVar9 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar9 = uVar1;
    }
    if (uVar9 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(this->final_script_sig).super_CScriptBase,
                 &(input->final_script_sig).super_CScriptBase);
    }
  }
  if (((this->final_script_witness).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->final_script_witness).stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((input->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (input->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=(&(this->final_script_witness).stack,&(input->final_script_witness).stack);
  }
  if (((this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((input->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (input->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->m_tap_key_sig,&input->m_tap_key_sig);
  }
  puVar10 = &this->m_tap_merkle_root;
  puVar8 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (&this->m_tap_internal_key,puVar10);
  if ((uint256 *)puVar8 == puVar10) {
    puVar8 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (&input->m_tap_internal_key,&input->m_tap_merkle_root);
    if ((uint256 *)puVar8 != &input->m_tap_merkle_root) {
      uVar5 = *(undefined8 *)
               (input->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               ((input->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)
               ((input->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)
            ((input->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
      *(undefined8 *)(this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
           uVar5;
      *(undefined8 *)
       ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
    }
  }
  puVar8 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (puVar10,this_00);
  if ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       *)puVar8 == this_00) {
    puVar8 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (&input->m_tap_merkle_root,&input->unknown);
    if ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)puVar8 != &input->unknown) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        uVar5 = *(undefined8 *)(input->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 ((input->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 ((input->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((input->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) =
             uVar7;
        *(undefined8 *)(puVar10->super_base_blob<256U>).m_data._M_elems = uVar5;
        *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 8) = uVar6
        ;
        return;
      }
      goto LAB_006cbc59;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_006cbc59:
  __stack_chk_fail();
}

Assistant:

void PSBTInput::Merge(const PSBTInput& input)
{
    if (!non_witness_utxo && input.non_witness_utxo) non_witness_utxo = input.non_witness_utxo;
    if (witness_utxo.IsNull() && !input.witness_utxo.IsNull()) {
        witness_utxo = input.witness_utxo;
    }

    partial_sigs.insert(input.partial_sigs.begin(), input.partial_sigs.end());
    ripemd160_preimages.insert(input.ripemd160_preimages.begin(), input.ripemd160_preimages.end());
    sha256_preimages.insert(input.sha256_preimages.begin(), input.sha256_preimages.end());
    hash160_preimages.insert(input.hash160_preimages.begin(), input.hash160_preimages.end());
    hash256_preimages.insert(input.hash256_preimages.begin(), input.hash256_preimages.end());
    hd_keypaths.insert(input.hd_keypaths.begin(), input.hd_keypaths.end());
    unknown.insert(input.unknown.begin(), input.unknown.end());
    m_tap_script_sigs.insert(input.m_tap_script_sigs.begin(), input.m_tap_script_sigs.end());
    m_tap_scripts.insert(input.m_tap_scripts.begin(), input.m_tap_scripts.end());
    m_tap_bip32_paths.insert(input.m_tap_bip32_paths.begin(), input.m_tap_bip32_paths.end());

    if (redeem_script.empty() && !input.redeem_script.empty()) redeem_script = input.redeem_script;
    if (witness_script.empty() && !input.witness_script.empty()) witness_script = input.witness_script;
    if (final_script_sig.empty() && !input.final_script_sig.empty()) final_script_sig = input.final_script_sig;
    if (final_script_witness.IsNull() && !input.final_script_witness.IsNull()) final_script_witness = input.final_script_witness;
    if (m_tap_key_sig.empty() && !input.m_tap_key_sig.empty()) m_tap_key_sig = input.m_tap_key_sig;
    if (m_tap_internal_key.IsNull() && !input.m_tap_internal_key.IsNull()) m_tap_internal_key = input.m_tap_internal_key;
    if (m_tap_merkle_root.IsNull() && !input.m_tap_merkle_root.IsNull()) m_tap_merkle_root = input.m_tap_merkle_root;
}